

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chipset.c
# Opt level: O1

int pfb_type(int chipset)

{
  uint uVar1;
  
  uVar1 = 1;
  if ((((2 < chipset) && (uVar1 = 2, 0xf < chipset)) &&
      (uVar1 = 3, chipset != 0x34 && 0x19 < chipset)) && (uVar1 = 0, 0x1f < chipset)) {
    uVar1 = 4;
    if ((((0x3f < chipset) && (uVar1 = 5, chipset != 0x40)) && (chipset != 0x45)) &&
       ((((0x4b < chipset || (chipset == 0x4a)) || (uVar1 = 6, (chipset & 0x7ffffffdU) == 0x44)) &&
        (uVar1 = 7, chipset == 0x50 || 0x7f < chipset)))) {
      uVar1 = chipset < 0xc0 ^ 9;
    }
  }
  return uVar1;
}

Assistant:

int pfb_type(int chipset) {
	if (chipset <3)
		return PFB_NV01;
	if (chipset < 0x10)
		return PFB_NV03;
	if (chipset < 0x1a || chipset == 0x34)
		return PFB_NV10;
	if (chipset < 0x20)
		return PFB_NONE; /* IGP */
	if (chipset < 0x40)
		return PFB_NV20;
	if (chipset == 0x40 || chipset == 0x45)
		return PFB_NV40;
	if (chipset != 0x44 && chipset != 0x46 && chipset != 0x4a && chipset < 0x4c)
		return PFB_NV41;
	if (chipset != 0x50 && chipset < 0x80)
		return PFB_NV44;
	if (chipset < 0xc0)
		return PFB_NV50;
	return PFB_NVC0;
}